

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

value_and_holder * __thiscall
pybind11::detail::instance::get_value_and_holder
          (value_and_holder *__return_storage_ptr__,instance *this,type_info *find_type,
          bool throw_if_missing)

{
  PyTypeObject *type;
  anon_union_24_2_63b86169_for_instance_1 *paVar1;
  iterator it;
  values_and_holders vhs;
  iterator iStack_68;
  values_and_holders local_38;
  
  if ((find_type == (type_info *)0x0) || (type = (this->ob_base).ob_type, type == find_type->type))
  {
    __return_storage_ptr__->inst = this;
    __return_storage_ptr__->index = 0;
    __return_storage_ptr__->type = find_type;
    if ((this->field_0x30 & 2) == 0) {
      paVar1 = (anon_union_24_2_63b86169_for_instance_1 *)(this->field_1).simple_value_holder[0];
    }
    else {
      paVar1 = &this->field_1;
    }
    __return_storage_ptr__->vh = (void **)paVar1;
  }
  else {
    local_38.inst = this;
    local_38.tinfo = all_type_info(type);
    values_and_holders::find(&iStack_68,&local_38,find_type);
    if (CONCAT44(iStack_68.curr.index._4_4_,(undefined4)iStack_68.curr.index) ==
        (long)((local_38.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)((local_38.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start >> 3) {
      if (throw_if_missing) {
        pybind11_fail(
                     "pybind11::detail::instance::get_value_and_holder: type is not a pybind11 base of the given instance (compile in debug mode for type details)"
                     );
      }
      iStack_68.curr.inst._0_4_ = 0;
      iStack_68.curr.inst._4_4_ = 0;
      iStack_68.curr.index._0_4_ = 0;
      iStack_68.curr.index._4_4_ = 0;
      __return_storage_ptr__->type = (type_info *)0x0;
      __return_storage_ptr__->vh = (void **)0x0;
    }
    else {
      __return_storage_ptr__->type = iStack_68.curr.type;
      __return_storage_ptr__->vh = iStack_68.curr.vh;
    }
    *(undefined4 *)&__return_storage_ptr__->inst = iStack_68.curr.inst._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->inst + 4) = iStack_68.curr.inst._4_4_;
    *(undefined4 *)&__return_storage_ptr__->index = (undefined4)iStack_68.curr.index;
    *(undefined4 *)((long)&__return_storage_ptr__->index + 4) = iStack_68.curr.index._4_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

PYBIND11_NOINLINE inline value_and_holder instance::get_value_and_holder(const type_info *find_type /*= nullptr default in common.h*/, bool throw_if_missing /*= true in common.h*/) {
    // Optimize common case:
    if (!find_type || Py_TYPE(this) == find_type->type)
        return value_and_holder(this, find_type, 0, 0);

    detail::values_and_holders vhs(this);
    auto it = vhs.find(find_type);
    if (it != vhs.end())
        return *it;

    if (!throw_if_missing)
        return value_and_holder();

#if defined(NDEBUG)
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: "
            "type is not a pybind11 base of the given instance "
            "(compile in debug mode for type details)");
#else
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: `" +
            get_fully_qualified_tp_name(find_type->type) + "' is not a pybind11 base of the given `" +
            get_fully_qualified_tp_name(Py_TYPE(this)) + "' instance");
#endif
}